

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_aef201::HandleSizeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  cmMakefile *this;
  bool bVar1;
  unsigned_long __val;
  string_view value;
  string local_38;
  
  a = (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)a == 0x60) {
    filename = a + 1;
    bVar1 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar1) {
      this = status->Makefile;
      __val = cmsys::SystemTools::FileLength(filename);
      std::__cxx11::to_string(&local_38,__val);
      value._M_str = local_38._M_dataplus._M_p;
      value._M_len = local_38._M_string_length;
      cmMakefile::AddDefinition(this,a + 2,value);
      std::__cxx11::string::~string((string *)&local_38);
      return true;
    }
    cmStrCat<char_const(&)[48],std::__cxx11::string_const&>
              (&local_38,(char (*) [48])"SIZE requested of path that is not readable:\n  ",filename)
    ;
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[42]>(&local_38,a,(char (*) [42])0x6e3f41);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return false;
}

Assistant:

bool HandleSizeCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  if (!cmSystemTools::FileExists(filename, true)) {
    status.SetError(
      cmStrCat("SIZE requested of path that is not readable:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(
    outputVariable, std::to_string(cmSystemTools::FileLength(filename)));

  return true;
}